

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

bool Cipher::normalizeSimilarityMap
               (TParameters *params,TSimilarityMap *ccMap,TSimilarityMap *logMap,
               TSimilarityMap *logMapInv)

{
  pointer pvVar1;
  long lVar2;
  int i_1;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  int i;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pvVar1 = (ccMap->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((long)(ccMap->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) * -0x55555555
  ;
  if ((int)uVar8 < 2) {
    dVar10 = 1e-06;
    dVar11 = 1.79769313486232e+308;
  }
  else {
    dVar11 = 1.79769313486232e+308;
    dVar10 = 2.2250738585072014e-308;
    uVar3 = 1;
    lVar4 = 0x10;
    uVar7 = 0;
    do {
      uVar5 = uVar7 + 1;
      pdVar6 = (double *)
               (*(long *)&pvVar1[uVar7].super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                          _M_impl.super__Vector_impl_data + lVar4);
      uVar7 = (ulong)(uVar8 & 0x7fffffff);
      dVar9 = dVar10;
      dVar12 = dVar11;
      do {
        dVar10 = *pdVar6;
        dVar11 = dVar10;
        if (dVar12 <= dVar10) {
          dVar11 = dVar12;
        }
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
        }
        pdVar6 = pdVar6 + 2;
        uVar7 = uVar7 - 1;
        dVar9 = dVar10;
        dVar12 = dVar11;
      } while (uVar3 != uVar7);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
      uVar7 = uVar5;
    } while (uVar5 != uVar8 - 1);
    dVar11 = dVar11 + -1e-06;
    dVar10 = dVar10 + 1e-06;
  }
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      lVar4 = 0;
      uVar3 = 0;
      do {
        lVar2 = *(long *)&(ccMap->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar7].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data;
        dVar9 = 1.0;
        if (uVar7 != uVar3) {
          dVar9 = (*(double *)(lVar2 + lVar4) - dVar11) / (dVar10 - dVar11);
          *(double *)(lVar2 + lVar4) = dVar9;
          dVar9 = pow(dVar9,params->fSpread);
        }
        *(double *)(lVar2 + lVar4) = dVar9;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while ((uVar8 & 0x7fffffff) != uVar3);
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar8 & 0x7fffffff));
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMap,ccMap);
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      lVar4 = 0;
      uVar3 = 0;
      do {
        lVar2 = *(long *)&(logMap->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar7].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data;
        dVar10 = 0.0;
        if (uVar7 != uVar3) {
          dVar10 = log(*(double *)(lVar2 + lVar4));
        }
        *(double *)(lVar2 + lVar4) = dVar10;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while ((uVar8 & 0x7fffffff) != uVar3);
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar8 & 0x7fffffff));
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMapInv,ccMap);
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      lVar4 = 0;
      uVar3 = 0;
      do {
        if (uVar7 == uVar3) {
          *(undefined8 *)
           (*(long *)&(logMap->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar7].
                      super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                      super__Vector_impl_data + lVar4) = 0xc12e848000000000;
        }
        else {
          lVar2 = *(long *)&(logMapInv->
                            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                            super__Vector_impl_data;
          dVar10 = log(1.0 - *(double *)(lVar2 + lVar4));
          *(double *)(lVar2 + lVar4) = dVar10;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while ((uVar8 & 0x7fffffff) != uVar3);
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar8 & 0x7fffffff));
  }
  return true;
}

Assistant:

bool normalizeSimilarityMap(
            const TParameters & params,
            TSimilarityMap & ccMap,
            TSimilarityMap & logMap,
            TSimilarityMap & logMapInv) {
        int n = ccMap.size();

        double ccMin = std::numeric_limits<double>::max();
        double ccMax = std::numeric_limits<double>::min();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccMin = std::min(ccMin, ccMap[j][i].cc);
                ccMax = std::max(ccMax, ccMap[j][i].cc);
            }
        }

        ccMin -= 1e-6;
        ccMax += 1e-6;

        //printf("ccMax = %g, ccMin = %g\n", ccMax, ccMin);

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    ccMap[j][i].cc = 1.0;
                    continue;
                }

                auto & v = ccMap[j][i].cc;
                v = (v - ccMin)/(ccMax - ccMin);
                v = std::pow(v, params.fSpread);
                //if (v < 0.50) {
                //    v = 1e-6;
                //}
                //v = 1.0 - std::exp(-1.1f*v);
            }
        }

        logMap = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = 0.0;
                    continue;
                }

                auto & v = logMap[j][i].cc;
                v = std::log(v);
            }
        }

        logMapInv = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = -1e6;
                    continue;
                }

                auto & v = logMapInv[j][i].cc;
                v = std::log(1.0 - v);
            }
        }

        return true;
    }